

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openglrenderer.h
# Opt level: O0

void __thiscall rengine::OpenGLRenderer::projectQuad(OpenGLRenderer *this,vec2 a,vec2 b,vec2 *v)

{
  vec3 v_00;
  vec3 v_01;
  vec3 v_02;
  mat4 *this_00;
  mat4 *this_01;
  vec2 vVar1;
  vec3 vVar2;
  vec3 local_178 [3];
  vec3 local_14c;
  vec3 local_140;
  vec2 local_130;
  vec3 local_120;
  vec3 local_110;
  vec3 local_fc;
  vec3 local_f0;
  vec2 local_e0;
  vec2 local_d8;
  vec3 local_d0;
  vec3 local_c0;
  vec3 local_ac;
  vec3 local_a0;
  vec2 local_90;
  vec2 local_88;
  vec3 local_80;
  vec3 local_70;
  vec2 local_60;
  vec3 local_54;
  vec3 local_48;
  vec2 local_38;
  vec2 local_30;
  vec2 *local_28;
  vec2 *v_local;
  OpenGLRenderer *this_local;
  vec2 b_local;
  vec2 a_local;
  
  this_01 = &this->m_m2d;
  this_00 = &this->m_m3d;
  local_60 = a;
  local_28 = v;
  v_local = (vec2 *)this;
  this_local = (OpenGLRenderer *)b;
  b_local = a;
  vec3::vec3(&local_54,a,0.0);
  local_70.z = local_54.z;
  local_70.x = local_54.x;
  local_70.y = local_54.y;
  v_02.z = local_54.z;
  v_02.x = local_54.x;
  v_02.y = local_54.y;
  vVar2 = mat4::operator*(this_00,v_02);
  local_80.z = vVar2.z;
  local_48.z = local_80.z;
  local_80._0_8_ = vVar2._0_8_;
  local_48.x = local_80.x;
  local_48.y = local_80.y;
  local_80 = vVar2;
  local_38 = vec3::project2D(&local_48,this->m_farPlane);
  local_30 = mat4::operator*(this_01,local_38);
  *local_28 = local_30;
  vec3::vec3(&local_ac,b_local.x,this_local._4_4_,0.0);
  local_c0.z = local_ac.z;
  local_c0.x = local_ac.x;
  local_c0.y = local_ac.y;
  v_01.z = local_ac.z;
  v_01.x = local_ac.x;
  v_01.y = local_ac.y;
  vVar2 = mat4::operator*(this_00,v_01);
  local_d0.z = vVar2.z;
  local_a0.z = local_d0.z;
  local_d0._0_8_ = vVar2._0_8_;
  local_a0.x = local_d0.x;
  local_a0.y = local_d0.y;
  local_d0 = vVar2;
  local_90 = vec3::project2D(&local_a0,this->m_farPlane);
  local_88 = mat4::operator*(this_01,local_90);
  local_28[1] = local_88;
  vec3::vec3(&local_fc,this_local._0_4_,b_local.y,0.0);
  local_110.z = local_fc.z;
  local_110.x = local_fc.x;
  local_110.y = local_fc.y;
  v_00.z = local_fc.z;
  v_00.x = local_fc.x;
  v_00.y = local_fc.y;
  vVar2 = mat4::operator*(this_00,v_00);
  local_120.z = vVar2.z;
  local_f0.z = local_120.z;
  local_120._0_8_ = vVar2._0_8_;
  local_f0.x = local_120.x;
  local_f0.y = local_120.y;
  local_120 = vVar2;
  local_e0 = vec3::project2D(&local_f0,this->m_farPlane);
  local_d8 = mat4::operator*(this_01,local_e0);
  local_28[2] = local_d8;
  vec3::vec3(&local_14c,(vec2)this_local,0.0);
  vVar2.z = local_14c.z;
  vVar2.x = local_14c.x;
  vVar2.y = local_14c.y;
  vVar2 = mat4::operator*(this_00,vVar2);
  local_178[0].z = vVar2.z;
  local_140.z = local_178[0].z;
  local_178[0]._0_8_ = vVar2._0_8_;
  local_140.x = local_178[0].x;
  local_140.y = local_178[0].y;
  local_130 = vec3::project2D(&local_140,this->m_farPlane);
  vVar1 = mat4::operator*(this_01,local_130);
  local_28[3] = vVar1;
  return;
}

Assistant:

inline void OpenGLRenderer::projectQuad(vec2 a, vec2 b, vec2 *v)
{
    // The steps involved in each line is as follows.:
    // pt_3d = matrix3D * pt                 // apply the 3D transform
    // pt_proj = pt_3d.project2D()           // project it to 2D based on current farPlane
    // pt_screen = parent_matrix * pt_proj   // Put the output of our local 3D into the scene world coordinate system
    v[0] = m_m2d * ((m_m3d * vec3(a))       .project2D(m_farPlane));    // top left
    v[1] = m_m2d * ((m_m3d * vec3(a.x, b.y)).project2D(m_farPlane));    // bottom left
    v[2] = m_m2d * ((m_m3d * vec3(b.x, a.y)).project2D(m_farPlane));    // top right
    v[3] = m_m2d * ((m_m3d * vec3(b))       .project2D(m_farPlane));    // bottom right
}